

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Manifest.h
# Opt level: O0

StringRef __thiscall llbuild::ninja::Scope::lookupBinding(Scope *this,StringRef name)

{
  bool bVar1;
  size_t sVar2;
  undefined8 uVar3;
  StringMapIterBase<llvm::StringMapConstIterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_llvm::StringMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_70;
  char *local_68;
  size_t local_60;
  StringMapIterBase<llvm::StringMapConstIterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_llvm::StringMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_58;
  const_iterator it;
  Scope *this_local;
  StringRef name_local;
  undefined8 local_30;
  
  local_60 = name.Length;
  local_68 = name.Data;
  it.
  super_StringMapIterBase<llvm::StringMapConstIterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_llvm::StringMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .Ptr = (StringMapIterBase<llvm::StringMapConstIterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_llvm::StringMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )(StringMapIterBase<llvm::StringMapConstIterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_llvm::StringMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )this;
  local_58.Ptr = (StringMapEntryBase **)
                 llvm::
                 StringMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llvm::MallocAllocator>
                 ::find(&this->entries,name);
  local_70.Ptr = (StringMapEntryBase **)
                 llvm::
                 StringMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llvm::MallocAllocator>
                 ::end(&this->entries);
  bVar1 = llvm::
          iterator_facade_base<llvm::StringMapConstIterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::forward_iterator_tag,_const_llvm::StringMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_long,_const_llvm::StringMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_const_llvm::StringMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
          ::operator!=((iterator_facade_base<llvm::StringMapConstIterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::forward_iterator_tag,_const_llvm::StringMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_long,_const_llvm::StringMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_const_llvm::StringMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
                        *)&local_58,
                       (StringMapConstIterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_70);
  if (bVar1) {
    llvm::
    iterator_facade_base<llvm::StringMapConstIterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::forward_iterator_tag,_const_llvm::StringMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_long,_const_llvm::StringMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_const_llvm::StringMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
    ::operator->((iterator_facade_base<llvm::StringMapConstIterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::forward_iterator_tag,_const_llvm::StringMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_long,_const_llvm::StringMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_const_llvm::StringMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
                  *)&local_58);
    sVar2 = std::__cxx11::string::data();
    name_local.Length = sVar2;
    uVar3 = std::__cxx11::string::length();
    local_30 = uVar3;
  }
  else if (this->parent == (Scope *)0x0) {
    strlen("");
  }
  else {
    join_0x00000010_0x00000000_ = lookupBinding(this->parent,name);
  }
  return stack0xffffffffffffffc8;
}

Assistant:

StringRef lookupBinding(StringRef name) const {
    auto it = entries.find(name);
    if (it != entries.end())
      return it->second;

    if (parent)
      return parent->lookupBinding(name);

    return "";
  }